

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.c++
# Opt level: O0

void __thiscall kj::AtomicRefcounted::~AtomicRefcounted(AtomicRefcounted *this)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  uint *local_40;
  undefined1 local_38 [8];
  DebugComparison<volatile_unsigned_int_&,_int> _kjCondition;
  AtomicRefcounted *this_local;
  
  (this->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00434d50;
  _kjCondition._32_8_ = this;
  local_40 = (uint *)_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->refcount);
  f.exception._4_4_ = 0;
  _::DebugExpression<unsigned_int_volatile&>::operator==
            ((DebugComparison<volatile_unsigned_int_&,_int> *)local_38,
             (DebugExpression<unsigned_int_volatile&> *)&local_40,(int *)((long)&f.exception + 4));
  bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int_volatile&,int>&,char_const(&)[50]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/refcount.c++"
               ,0x33,FAILED,"refcount == 0",
               "_kjCondition,\"Refcounted object deleted with non-zero refcount.\"",
               (DebugComparison<volatile_unsigned_int_&,_int> *)local_38,
               (char (*) [50])"Refcounted object deleted with non-zero refcount.");
    _::Debug::Fault::fatal(&local_50);
  }
  return;
}

Assistant:

AtomicRefcounted::~AtomicRefcounted() noexcept(false) {
  KJ_ASSERT(refcount == 0, "Refcounted object deleted with non-zero refcount.");
}